

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_4ac6::TestMakeCopy(bool use_local_arena)

{
  bool *pbVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  undefined8 uVar24;
  int iVar25;
  TemplateString *this;
  TemplateString *pTVar26;
  TemplateString *pTVar27;
  long lVar28;
  long *plVar29;
  undefined8 extraout_RAX;
  bool *pbVar30;
  BaseArena *pBVar31;
  string copy;
  string orig;
  UnsafeArena local_arena;
  undefined1 local_498 [24];
  undefined8 local_480;
  char *local_478;
  undefined8 uStack_470;
  undefined1 local_468;
  undefined7 uStack_467;
  undefined8 uStack_460;
  char *local_458;
  undefined8 uStack_450;
  undefined1 local_448;
  undefined7 uStack_447;
  undefined8 uStack_440;
  char *local_438;
  undefined8 uStack_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  char *local_418;
  undefined8 uStack_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined8 uStack_400;
  char *local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  undefined8 uStack_3e0;
  char *local_3d8;
  undefined8 uStack_3d0;
  undefined1 local_3c8;
  undefined7 uStack_3c7;
  undefined8 uStack_3c0;
  char *local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  undefined8 uStack_3a0;
  char *local_398;
  undefined8 uStack_390;
  undefined1 local_388;
  undefined7 uStack_387;
  undefined8 uStack_380;
  char *local_378;
  undefined8 uStack_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined8 uStack_360;
  char *local_358;
  undefined8 uStack_350;
  undefined1 local_348;
  undefined7 uStack_347;
  undefined8 uStack_340;
  char *local_338;
  undefined8 uStack_330;
  undefined1 local_328;
  undefined7 uStack_327;
  undefined8 uStack_320;
  char *local_318;
  undefined8 uStack_310;
  undefined1 local_308;
  undefined7 uStack_307;
  undefined8 uStack_300;
  char *local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  undefined8 uStack_2e0;
  char *local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  undefined8 uStack_2c0;
  char *local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  char *local_298;
  undefined8 uStack_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  char *local_278;
  undefined8 uStack_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  char *local_258;
  undefined8 uStack_250;
  undefined1 local_248;
  undefined7 uStack_247;
  undefined8 uStack_240;
  char *local_238;
  undefined8 uStack_230;
  undefined1 local_228;
  undefined7 uStack_227;
  undefined8 uStack_220;
  char *local_218;
  undefined8 uStack_210;
  undefined1 local_208;
  undefined7 uStack_207;
  undefined8 uStack_200;
  char *local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  undefined8 uStack_1e0;
  char *local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  TemplateString local_1b8;
  undefined **local_198 [45];
  
  ctemplate::BaseArena::BaseArena((BaseArena *)local_198,(char *)0x0,0x400,false);
  local_198[0] = &PTR__BaseArena_0011dc00;
  this = (TemplateString *)operator_new(0x70);
  pBVar31 = (BaseArena *)local_198;
  if (!use_local_arena) {
    pBVar31 = (BaseArena *)0x0;
  }
  local_1b8.ptr_ = "testdict";
  local_1b8.length_ = 8;
  local_1b8.is_immutable_ = true;
  local_1b8.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)this,&local_1b8,(UnsafeArena *)pBVar31);
  local_1d8 = "TOPLEVEL";
  uStack_1d0 = 8;
  local_1c8 = 1;
  uStack_1c0 = 0;
  local_1f8 = "foo";
  uStack_1f0 = 3;
  local_1e8 = 1;
  uStack_1e0 = 0;
  TVar17._17_7_ = uStack_1e7;
  TVar17.is_immutable_ = true;
  TVar2._17_7_ = uStack_1c7;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 8;
  TVar2.ptr_ = "TOPLEVEL";
  TVar2.id_ = 0;
  TVar17.length_ = 3;
  TVar17.ptr_ = "foo";
  TVar17.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar17);
  local_218 = "TEMPLATELEVEL";
  uStack_210 = 0xd;
  local_208 = 1;
  uStack_200 = 0;
  local_238 = "foo3";
  uStack_230 = 4;
  local_228 = 1;
  uStack_220 = 0;
  TVar18._17_7_ = uStack_227;
  TVar18.is_immutable_ = true;
  TVar3._17_7_ = uStack_207;
  TVar3.is_immutable_ = true;
  TVar3.length_ = 0xd;
  TVar3.ptr_ = "TEMPLATELEVEL";
  TVar3.id_ = 0;
  TVar18.length_ = 4;
  TVar18.ptr_ = "foo3";
  TVar18.id_ = 0;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar3,TVar18);
  local_258 = "include1";
  uStack_250 = 8;
  local_248 = 1;
  uStack_240 = 0;
  TVar4._17_7_ = uStack_247;
  TVar4.is_immutable_ = true;
  TVar4.length_ = 8;
  TVar4.ptr_ = "include1";
  TVar4.id_ = 0;
  pTVar26 = (TemplateString *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar4);
  local_278 = "incfile1a";
  uStack_270 = 9;
  local_268 = 1;
  uStack_260 = 0;
  TVar5._17_7_ = uStack_267;
  TVar5.is_immutable_ = true;
  TVar5.length_ = 9;
  TVar5.ptr_ = "incfile1a";
  TVar5.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar5);
  local_298 = "SUBLEVEL";
  uStack_290 = 8;
  local_288 = 1;
  uStack_280 = 0;
  local_2b8 = "subfoo";
  uStack_2b0 = 6;
  local_2a8 = 1;
  uStack_2a0 = 0;
  TVar19._17_7_ = uStack_2a7;
  TVar19.is_immutable_ = true;
  TVar6._17_7_ = uStack_287;
  TVar6.is_immutable_ = true;
  TVar6.length_ = 8;
  TVar6.ptr_ = "SUBLEVEL";
  TVar6.id_ = 0;
  TVar19.length_ = 6;
  TVar19.ptr_ = "subfoo";
  TVar19.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar6,TVar19);
  local_2d8 = "include1";
  uStack_2d0 = 8;
  local_2c8 = 1;
  uStack_2c0 = 0;
  TVar7._17_7_ = uStack_2c7;
  TVar7.is_immutable_ = true;
  TVar7.length_ = 8;
  TVar7.ptr_ = "include1";
  TVar7.id_ = 0;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar7);
  local_2f8 = "SUBLEVEL";
  uStack_2f0 = 8;
  local_2e8 = 1;
  uStack_2e0 = 0;
  local_318 = "subbar";
  uStack_310 = 6;
  local_308 = 1;
  uStack_300 = 0;
  TVar20._17_7_ = uStack_307;
  TVar20.is_immutable_ = true;
  TVar8._17_7_ = uStack_2e7;
  TVar8.is_immutable_ = true;
  TVar8.length_ = 8;
  TVar8.ptr_ = "SUBLEVEL";
  TVar8.id_ = 0;
  TVar20.length_ = 6;
  TVar20.ptr_ = "subbar";
  TVar20.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar20);
  local_338 = "section1";
  uStack_330 = 8;
  local_328 = 1;
  uStack_320 = 0;
  TVar9._17_7_ = uStack_327;
  TVar9.is_immutable_ = true;
  TVar9.length_ = 8;
  TVar9.ptr_ = "section1";
  TVar9.id_ = 0;
  pTVar27 = (TemplateString *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
  local_358 = "section1";
  uStack_350 = 8;
  local_348 = 1;
  uStack_340 = 0;
  TVar10._17_7_ = uStack_347;
  TVar10.is_immutable_ = true;
  TVar10.length_ = 8;
  TVar10.ptr_ = "section1";
  TVar10.id_ = 0;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar10);
  local_378 = "SUBLEVEL";
  uStack_370 = 8;
  local_368 = 1;
  uStack_360 = 0;
  local_398 = "subfoo";
  uStack_390 = 6;
  local_388 = 1;
  uStack_380 = 0;
  TVar21._17_7_ = uStack_387;
  TVar21.is_immutable_ = true;
  TVar11._17_7_ = uStack_367;
  TVar11.is_immutable_ = true;
  TVar11.length_ = 8;
  TVar11.ptr_ = "SUBLEVEL";
  TVar11.id_ = 0;
  TVar21.length_ = 6;
  TVar21.ptr_ = "subfoo";
  TVar21.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar11,TVar21);
  local_3b8 = "SUBLEVEL";
  uStack_3b0 = 8;
  local_3a8 = 1;
  uStack_3a0 = 0;
  local_3d8 = "subbar";
  uStack_3d0 = 6;
  local_3c8 = 1;
  uStack_3c0 = 0;
  TVar22._17_7_ = uStack_3c7;
  TVar22.is_immutable_ = true;
  TVar12._17_7_ = uStack_3a7;
  TVar12.is_immutable_ = true;
  TVar12.length_ = 8;
  TVar12.ptr_ = "SUBLEVEL";
  TVar12.id_ = 0;
  TVar22.length_ = 6;
  TVar22.ptr_ = "subbar";
  TVar22.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar12,TVar22);
  local_3f8 = "section2";
  uStack_3f0 = 8;
  local_3e8 = 1;
  uStack_3e0 = 0;
  TVar13._17_7_ = uStack_3e7;
  TVar13.is_immutable_ = true;
  TVar13.length_ = 8;
  TVar13.ptr_ = "section2";
  TVar13.id_ = 0;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar13);
  local_418 = "TOPLEVEL";
  uStack_410 = 8;
  local_408 = 1;
  uStack_400 = 0;
  local_438 = "bar";
  uStack_430 = 3;
  local_428 = 1;
  uStack_420 = 0;
  TVar23._17_7_ = uStack_427;
  TVar23.is_immutable_ = true;
  TVar14._17_7_ = uStack_407;
  TVar14.is_immutable_ = true;
  TVar14.length_ = 8;
  TVar14.ptr_ = "TOPLEVEL";
  TVar14.id_ = 0;
  TVar23.length_ = 3;
  TVar23.ptr_ = "bar";
  TVar23.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar14,TVar23);
  local_458 = "sub";
  uStack_450 = 3;
  local_448 = 1;
  uStack_440 = 0;
  TVar15._17_7_ = uStack_447;
  TVar15.is_immutable_ = true;
  TVar15.length_ = 3;
  TVar15.ptr_ = "sub";
  TVar15.id_ = 0;
  lVar28 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar15);
  local_478 = "GLOBAL";
  uStack_470 = 6;
  local_468 = 1;
  uStack_460 = 0;
  TVar16._17_7_ = uStack_467;
  TVar16.is_immutable_ = true;
  TVar16.length_ = 6;
  TVar16.ptr_ = "GLOBAL";
  TVar16.id_ = 0;
  ctemplate::TemplateDictionary::SetIntValue(TVar16,lVar28);
  pbVar1 = &local_1b8.is_immutable_;
  local_1b8.length_ = 0;
  local_1b8.is_immutable_ = false;
  local_1b8.ptr_ = pbVar1;
  (**(code **)(this->ptr_ + 0x20))(this,&local_1b8,0);
  local_498._0_8_ = "testdict";
  local_498._8_8_ = 8;
  local_498[0x10] = 1;
  local_480 = 0;
  plVar29 = (long *)ctemplate::TemplateDictionary::MakeCopy(this,(UnsafeArena *)local_498);
  local_498._0_8_ = "copy of subdict";
  local_498._8_8_ = 0xf;
  local_498[0x10] = 1;
  local_480 = 0;
  lVar28 = ctemplate::TemplateDictionary::MakeCopy(pTVar26,(UnsafeArena *)local_498);
  if (lVar28 == 0) {
    local_498._0_8_ = "copy of subdict";
    local_498._8_8_ = 0xf;
    local_498[0x10] = 1;
    local_480 = 0;
    lVar28 = ctemplate::TemplateDictionary::MakeCopy(pTVar27,(UnsafeArena *)local_498);
    if (lVar28 == 0) {
      (**(code **)(this->ptr_ + 8))(this);
      pTVar26 = (TemplateString *)(local_498 + 0x10);
      local_498._8_8_ = 0;
      local_498[0x10] = 0;
      local_498._0_8_ = pTVar26;
      (**(code **)(*plVar29 + 0x20))(plVar29,local_498,0);
      (**(code **)(*plVar29 + 8))(plVar29);
      pbVar30 = (bool *)local_1b8.ptr_;
      uVar24 = local_498._0_8_;
      iVar25 = strcmp(local_1b8.ptr_,(char *)local_498._0_8_);
      if (iVar25 == 0) {
        if ((TemplateString *)uVar24 != pTVar26) {
          operator_delete((void *)uVar24);
          pbVar30 = (bool *)local_1b8.ptr_;
        }
        if (pbVar30 != pbVar1) {
          operator_delete(pbVar30);
        }
        ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
        return;
      }
      goto LAB_0011214f;
    }
  }
  else {
    _GLOBAL__N_1::TestMakeCopy();
  }
  _GLOBAL__N_1::TestMakeCopy();
LAB_0011214f:
  _GLOBAL__N_1::TestMakeCopy();
  if ((TemplateString *)local_498._0_8_ != pTVar26) {
    operator_delete((void *)local_498._0_8_);
  }
  if ((bool *)local_1b8.ptr_ != pbVar1) {
    operator_delete(local_1b8.ptr_);
  }
  ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static void TestMakeCopy(bool use_local_arena) {
  UnsafeArena local_arena(1024);
  UnsafeArena* arena = NULL;
  if (use_local_arena)
    arena = &local_arena;

  // First, let's make a non-trivial template dictionary (We use
  // 'new' because later we'll test deleting this dict but keeping
  // around the copy.)
  TemplateDictionary* dict = new TemplateDictionary("testdict", arena);

  dict->SetValue("TOPLEVEL", "foo");

  dict->SetTemplateGlobalValue("TEMPLATELEVEL", "foo3");

  TemplateDictionary* subdict_1a = dict->AddIncludeDictionary("include1");
  subdict_1a->SetFilename("incfile1a");
  subdict_1a->SetValue("SUBLEVEL", "subfoo");
  TemplateDictionary* subdict_1b = dict->AddIncludeDictionary("include1");
  // Let's try not calling SetFilename on this one.
  subdict_1b->SetValue("SUBLEVEL", "subbar");

  TemplateDictionary* subdict_2a = dict->AddSectionDictionary("section1");
  TemplateDictionary* subdict_2b = dict->AddSectionDictionary("section1");
  subdict_2a->SetValue("SUBLEVEL", "subfoo");
  subdict_2b->SetValue("SUBLEVEL", "subbar");
  TemplateDictionary* subdict_3 = dict->AddSectionDictionary("section2");
  subdict_3->SetValue("TOPLEVEL", "bar");    // overriding top dict
  TemplateDictionary* subdict_3_1 = subdict_3->AddSectionDictionary("sub");
  subdict_3_1->SetIntValue("GLOBAL", 21);    // overrides value in setUp()

  string orig;
  dict->DumpToString(&orig);

  // Make a copy
  TemplateDictionary* dict_copy = dict->MakeCopy("testdict", NULL);
  // Make sure it doesn't work to copy a sub-dictionary
  EXPECT_TRUE(subdict_1a->MakeCopy("copy of subdict") == NULL);
  EXPECT_TRUE(subdict_2a->MakeCopy("copy of subdict") == NULL);

  // Delete the original dict, to make sure the copy really is independent
  delete dict;
  dict = NULL;
  string copy;
  dict_copy->DumpToString(&copy);
  delete dict_copy;

  EXPECT_STREQ(orig.c_str(), copy.c_str());
}